

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-cubic.c
# Opt level: O3

void cubic_on_acked(quicly_cc_t *cc,quicly_loss_t *loss,uint32_t bytes,uint64_t largest_acked,
                   uint32_t inflight,int64_t now,uint32_t max_udp_payload_size)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  
  if (inflight < bytes) {
    __assert_fail("inflight >= bytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/cc-cubic.c"
                  ,0x42,
                  "void cubic_on_acked(quicly_cc_t *, const quicly_loss_t *, uint32_t, uint64_t, uint32_t, int64_t, uint32_t)"
                 );
  }
  if (largest_acked < cc->recovery_end) {
    return;
  }
  uVar1 = cc->cwnd;
  if (uVar1 < cc->ssthresh) {
    uVar1 = uVar1 + bytes;
    cc->cwnd = uVar1;
  }
  else {
    auVar6._0_8_ = (double)(now - (cc->state).cubic.avoidance_start);
    auVar6._8_8_ = (double)(loss->rtt).smoothed;
    auVar6 = divpd(auVar6,_DAT_0013b1c0);
    dVar8 = (cc->state).cubic.k;
    dVar5 = auVar6._0_8_;
    dVar3 = dVar5 - dVar8;
    dVar4 = (double)max_udp_payload_size;
    dVar7 = (double)(cc->state).cubic.w_max;
    uVar2 = (uint)(long)(dVar7 * 0.7 + (dVar5 / auVar6._8_8_) * 0.5294117647058825 * dVar4);
    if ((uint)(long)(dVar3 * dVar3 * dVar3 * 0.4 * dVar4 + dVar7) < uVar2) {
      if (uVar2 <= uVar1) goto LAB_0012fe15;
    }
    else {
      dVar8 = (auVar6._8_8_ + dVar5) - dVar8;
      dVar8 = (double)((long)(dVar8 * dVar8 * dVar8 * 0.4 * dVar4 + dVar7) & 0xffffffff);
      dVar3 = (double)uVar1;
      if (dVar8 <= dVar3) goto LAB_0012fe15;
      uVar2 = (uint)(long)((dVar8 / dVar3 + -1.0) * dVar4 + dVar3);
    }
    uVar1 = uVar2;
    cc->cwnd = uVar1;
  }
LAB_0012fe15:
  if (cc->cwnd_maximum < uVar1) {
    cc->cwnd_maximum = uVar1;
  }
  return;
}

Assistant:

static void cubic_on_acked(quicly_cc_t *cc, const quicly_loss_t *loss, uint32_t bytes, uint64_t largest_acked, uint32_t inflight,
                           int64_t now, uint32_t max_udp_payload_size)
{
    assert(inflight >= bytes);
    /* Do not increase congestion window while in recovery. */
    if (largest_acked < cc->recovery_end)
        return;

    /* Slow start. */
    if (cc->cwnd < cc->ssthresh) {
        cc->cwnd += bytes;
        if (cc->cwnd_maximum < cc->cwnd)
            cc->cwnd_maximum = cc->cwnd;
        return;
    }

    /* Congestion avoidance. */
    cubic_float_t t_sec = calc_cubic_t(cc, now);
    cubic_float_t rtt_sec = loss->rtt.smoothed / (cubic_float_t)1000; /* ms -> s */

    uint32_t w_cubic = calc_w_cubic(cc, t_sec, max_udp_payload_size);
    uint32_t w_est = calc_w_est(cc, t_sec, rtt_sec, max_udp_payload_size);

    if (w_cubic < w_est) {
        /* RFC 8312, Section 4.2; TCP-Friendly Region */
        /* Prevent cwnd from shrinking if W_est is reduced due to RTT increase */
        if (w_est > cc->cwnd)
            cc->cwnd = w_est;
    } else {
        /* RFC 8312, Section 4.3/4.4; CUBIC Region */
        cubic_float_t w_cubic_target = calc_w_cubic(cc, t_sec + rtt_sec, max_udp_payload_size);
        /* After fast convergence W_max < W_last_max holds, and hence W_cubic(0) = beta * W_max < beta * W_last_max = cwnd.
         * cwnd could thus shrink without this check (but only after fast convergence). */
        if (w_cubic_target > cc->cwnd)
            /* (W_cubic(t+RTT) - cwnd)/cwnd * MSS = (W_cubic(t+RTT)/cwnd - 1) * MSS */
            cc->cwnd += ((w_cubic_target / cc->cwnd) - 1) * max_udp_payload_size;
    }

    if (cc->cwnd_maximum < cc->cwnd)
        cc->cwnd_maximum = cc->cwnd;
}